

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O0

void Eigen::internal::
     call_triangular_assignment_loop<10,false,Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>,10u>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::swap_assign_op<double>>
               (TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *dst,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *src,
               swap_assign_op<double> *func)

{
  Index IVar1;
  TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_> *pTVar2;
  Index rows;
  DstEvaluatorType *dst_00;
  SrcEvaluatorType *in_RDX;
  EigenBase<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_> *in_RDI;
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  Index dstCols;
  Index dstRows;
  SrcEvaluatorType srcEvaluator;
  swap_assign_op<double> *in_stack_ffffffffffffff48;
  evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *in_stack_ffffffffffffff50
  ;
  TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>
  *in_stack_ffffffffffffff60;
  TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_> *this;
  
  evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::evaluator
            (in_stack_ffffffffffffff50,
             (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffff48);
  IVar1 = Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x153441);
  pTVar2 = (TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_> *)
           Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                     ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x153462);
  this = pTVar2;
  rows = TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>::rows
                   ((TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *)0x153480);
  if (rows == IVar1) {
    in_stack_ffffffffffffff60 =
         (TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_> *)
         TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>::cols
                   ((TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *)0x1534a3);
    if (in_stack_ffffffffffffff60 == pTVar2) goto LAB_001534e7;
  }
  TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>::resize
            (this,rows,(Index)in_stack_ffffffffffffff60);
LAB_001534e7:
  evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>::evaluator
            ((evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_> *)
             in_stack_ffffffffffffff50,
             (TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *)
             in_stack_ffffffffffffff48);
  dst_00 = (DstEvaluatorType *)
           EigenBase<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>::
           const_cast_derived(in_RDI);
  triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::swap_assign_op<double>,_0>
  ::triangular_dense_assignment_kernel
            ((triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_0>
              *)in_stack_ffffffffffffff60,dst_00,in_RDX,in_stack_ffffffffffffff48,
             (DstXprType *)0x15353d);
  triangular_assignment_loop<Eigen::internal::triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::swap_assign_op<double>,_0>,_10U,_-1,_false>
  ::run((triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_0>
         *)this);
  evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>::~evaluator
            ((evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_> *)
             0x153555);
  evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::~evaluator
            ((evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)0x153562);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_triangular_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
    dst.resize(dstRows, dstCols);
  DstEvaluatorType dstEvaluator(dst);
    
  typedef triangular_dense_assignment_kernel< Mode&(Lower|Upper),Mode&(UnitDiag|ZeroDiag|SelfAdjoint),SetOpposite,
                                              DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());
  
  enum {
      unroll = DstXprType::SizeAtCompileTime != Dynamic
            && SrcEvaluatorType::CoeffReadCost < HugeCost
            && DstXprType::SizeAtCompileTime * (DstEvaluatorType::CoeffReadCost+SrcEvaluatorType::CoeffReadCost) / 2 <= EIGEN_UNROLLING_LIMIT
    };
  
  triangular_assignment_loop<Kernel, Mode, unroll ? int(DstXprType::SizeAtCompileTime) : Dynamic, SetOpposite>::run(kernel);
}